

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

AddressFormatData *
cfd::core::AddressFormatData::ConvertFromJson
          (AddressFormatData *__return_storage_ptr__,string *json_data)

{
  bool bVar1;
  string *__args_1;
  size_type sVar2;
  undefined8 uVar3;
  size_t in_RCX;
  void *__buf;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar4;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffe48;
  CfdError error_code;
  reference in_stack_fffffffffffffe50;
  bool local_17a;
  allocator local_159;
  string local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130;
  reference local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *child;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  json_map;
  string local_d0;
  undefined1 local_b0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  prefix_map;
  undefined1 local_70 [8];
  UniValue object;
  string *json_data_local;
  AddressFormatData *result;
  
  object.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)json_data;
  UniValue::UniValue((UniValue *)local_70);
  UniValue::read((UniValue *)local_70,
                 (int)object.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,__buf,in_RCX);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x455562);
  json_map._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  json_map._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  bVar1 = UniValue::isObject((UniValue *)local_70);
  local_17a = false;
  if (bVar1) {
    ::std::allocator<char>::allocator();
    json_map._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
    ::std::__cxx11::string::string
              ((string *)&local_d0,"nettype",
               (allocator *)((long)&json_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    json_map._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
    local_17a = UniValue::exists((UniValue *)local_70,&local_d0);
  }
  if ((json_map._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((json_map._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&json_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe48._M_node >> 0x20);
  if (local_17a != false) {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           *)&__range3);
    UniValue::getObjMap((UniValue *)local_70,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                         *)&__range3);
    __end3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                      *)&__range3);
    child = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                      *)&__range3);
    while( true ) {
      bVar1 = ::std::operator!=(&__end3,(_Self *)&child);
      error_code = (CfdError)((ulong)in_stack_fffffffffffffe48._M_node >> 0x20);
      if (!bVar1) break;
      local_128 = ::std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  ::operator*(&__end3);
      bVar1 = UniValue::isStr(&local_128->second);
      if (bVar1) {
        in_stack_fffffffffffffe50 = local_128;
        __args_1 = UniValue::getValStr_abi_cxx11_(&local_128->second);
        pVar4 = ::std::
                map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::emplace<std::__cxx11::string_const&,std::__cxx11::string_const&>
                          ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)local_b0,&in_stack_fffffffffffffe50->first,__args_1);
        in_stack_fffffffffffffe48 = pVar4.first._M_node;
        in_stack_fffffffffffffe47 = pVar4.second;
        local_138 = in_stack_fffffffffffffe48._M_node;
        local_130 = in_stack_fffffffffffffe47;
      }
      ::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
      ::operator++(&__end3);
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)&__range3);
  }
  bVar1 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b0);
  if ((!bVar1) &&
     (sVar2 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_b0), sVar2 != 0)) {
    AddressFormatData(__return_storage_ptr__,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_b0);
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x455942);
    UniValue::~UniValue((UniValue *)local_70);
    return __return_storage_ptr__;
  }
  uVar3 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_158,"Invalid address prefix json data.",&local_159);
  CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffffe50,error_code,
             (string *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

AddressFormatData AddressFormatData::ConvertFromJson(
    const std::string& json_data) {
  UniValue object;
  object.read(json_data);
  std::map<std::string, std::string> prefix_map;
  if (object.isObject() && object.exists(kNettype)) {
    std::map<std::string, UniValue> json_map;
    object.getObjMap(json_map);
    for (const auto& child : json_map) {
      if (child.second.isStr()) {
        prefix_map.emplace(child.first, child.second.getValStr());
      }
    }
  }
  if (prefix_map.empty() || (prefix_map.size() == 0)) {
    throw CfdException(
        kCfdIllegalArgumentError, "Invalid address prefix json data.");
  }
  AddressFormatData result(prefix_map);
  return result;
}